

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O3

char * __thiscall util::fs::basename(fs *this,char *__filename)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = *(long *)(__filename + 8);
  do {
    lVar2 = lVar3 + -1;
    if (lVar3 == 0) {
      *(fs **)this = this + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)this,anon_var_dwarf_29a9c + 0xb);
      return (char *)this;
    }
    pcVar1 = (char *)(*(long *)__filename + -1 + lVar3);
    lVar3 = lVar2;
  } while (*pcVar1 == '/');
  do {
    if (lVar2 == 0) break;
    pcVar1 = (char *)(*(long *)__filename + -1 + lVar2);
    lVar2 = lVar2 + -1;
  } while (*pcVar1 != '/');
  std::__cxx11::string::substr((ulong)this,(ulong)__filename);
  return (char *)this;
}

Assistant:

std::string
basename (std::string const& path)
{
    /* Skip group of slashes at the end. */
    std::size_t len = path.size();
    while (len > 0 && path[len - 1] == '/')
        len -= 1;
    if (len == 0)
        return "";

    /* Skip basename. */
    std::size_t base = len - 1;
    while (base > 0 && path[base - 1] != '/')
        base -= 1;

    return path.substr(base, len - base);
}